

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_flags
                 (lysc_ctx *ctx,uint16_t parsed_flags,uint16_t inherited_flags,lysc_node *node)

{
  byte *pbVar1;
  uint uVar2;
  lysc_node *plVar3;
  ushort uVar4;
  LY_ERR LVar5;
  ushort uVar6;
  char *parent_name;
  
  uVar4 = parsed_flags & 0xe3;
  node->flags = uVar4;
  if (((parsed_flags & 3) != 0) && (node->nodetype == 0x80)) {
    __assert_fail("(node->nodetype != LYS_CASE) || !(node->flags & LYS_CONFIG_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xa41,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
  }
  if ((ctx->compile_opts & 4) == 0) {
    if ((parsed_flags & 3) == 0) {
      plVar3 = node->parent;
      if (plVar3 != (lysc_node *)0x0) {
        uVar6 = plVar3->flags & 3;
        if (uVar6 != 0) {
          uVar4 = uVar6 | uVar4;
          goto LAB_00149577;
        }
        if (-1 < (short)plVar3->nodetype) {
          __assert_fail("!node->parent || (node->parent->flags & LYS_CONFIG_MASK) || (node->parent->nodetype & LYS_AUGMENT)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                        ,0xa48,"LY_ERR lys_compile_config(struct lysc_ctx *, struct lysc_node *)");
        }
      }
      uVar4 = uVar4 | 1;
    }
    else {
      uVar4 = uVar4 | 0x800;
    }
  }
  else {
    uVar4 = parsed_flags & 0xe0;
  }
LAB_00149577:
  node->flags = uVar4;
  plVar3 = node->parent;
  if (plVar3 == (lysc_node *)0x0) {
    uVar6 = 0;
    parent_name = (char *)0x0;
  }
  else {
    uVar6 = plVar3->flags;
    if (((uVar6 & 2) != 0) && ((uVar4 & 1) != 0)) {
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
              "Configuration node cannot be child of any state data node.");
      return LY_EVALID;
    }
    parent_name = plVar3->name;
  }
  LVar5 = lys_compile_status(ctx,parsed_flags,inherited_flags,uVar6,parent_name,node->name,
                             &node->flags);
  if (LVar5 == LY_SUCCESS) {
    uVar2 = ctx->compile_opts;
    if (((uVar2 >> 0xc & 1) == 0) || (node->nodetype == 0x1000)) {
      if (((uVar2 >> 0xd & 1) == 0) || (node->nodetype == 0x2000)) {
        if ((uVar2 >> 0xe & 1) == 0) {
          return LY_SUCCESS;
        }
        if (node->nodetype == 0x400) {
          return LY_SUCCESS;
        }
        pbVar1 = (byte *)((long)&node->flags + 1);
        *pbVar1 = *pbVar1 | 0x40;
        return LY_SUCCESS;
      }
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 0x20;
    }
    else {
      pbVar1 = (byte *)((long)&node->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    LVar5 = LY_SUCCESS;
  }
  return LVar5;
}

Assistant:

static LY_ERR
lys_compile_node_flags(struct lysc_ctx *ctx, uint16_t parsed_flags, uint16_t inherited_flags, struct lysc_node *node)
{
    uint16_t parent_flags;
    const char *parent_name;

    /* copy flags except for status */
    node->flags = (parsed_flags & LYS_FLAGS_COMPILED_MASK) & ~LYS_STATUS_MASK;

    /* inherit config flags */
    LY_CHECK_RET(lys_compile_config(ctx, node));

    /* compile status */
    parent_flags = node->parent ? node->parent->flags : 0;
    parent_name = node->parent ? node->parent->name : NULL;
    LY_CHECK_RET(lys_compile_status(ctx, parsed_flags, inherited_flags, parent_flags, parent_name, node->name, &node->flags));

    /* other flags */
    if ((ctx->compile_opts & LYS_IS_INPUT) && (node->nodetype != LYS_INPUT)) {
        node->flags |= LYS_IS_INPUT;
    } else if ((ctx->compile_opts & LYS_IS_OUTPUT) && (node->nodetype != LYS_OUTPUT)) {
        node->flags |= LYS_IS_OUTPUT;
    } else if ((ctx->compile_opts & LYS_IS_NOTIF) && (node->nodetype != LYS_NOTIF)) {
        node->flags |= LYS_IS_NOTIF;
    }

    return LY_SUCCESS;
}